

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanystringview.h
# Opt level: O0

bool QAnyStringView::isAsciiOnlyCharsAtCompileTime<QChar_const>(QChar *str,qsizetype sz)

{
  qsizetype sz_local;
  QChar *str_local;
  
  return false;
}

Assistant:

static constexpr bool isAsciiOnlyCharsAtCompileTime(Char *str, qsizetype sz) noexcept
    {
        // do not perform check if not at compile time
        if (!q20::is_constant_evaluated())
            return false;
        if constexpr (sizeof(Char) != sizeof(char)) {
            Q_UNUSED(str);
            Q_UNUSED(sz);
            return false;
        } else {
            for (qsizetype i = 0; i < sz; ++i) {
                if (uchar(str[i]) > 0x7f)
                    return false;
            }
            return true;
        }
    }